

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

ostream * gl4cts::anon_unknown_0::operator<<(ostream *stream,imageStoreCall *store)

{
  long lVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"imageStore(",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"u_image_",8);
  std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
  ImageLoadStoreMultipleUniformsTest::writeCoordinatesVariableNameToStream
            (stream,store->m_index,store->m_row);
  if (store->m_row == 0) {
    pcVar2 = ", -";
    lVar1 = 3;
  }
  else {
    pcVar2 = ", ";
    lVar1 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"loaded_value_",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(stream,");",2);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const imageStoreCall& store)
	{
		/* imageStore(u_image_0, row_0_coordinates_0, -loaded_value_0); */
		stream << "imageStore(";

		writeImageUniformNameToStream(stream, store.m_index);

		stream << ", ";

		writeCoordinatesVariableNameToStream(stream, store.m_index, store.m_row);

		if (0 == store.m_row)
		{
			stream << ", -";
		}
		else
		{
			stream << ", ";
		}

		writeLoadedValueVariableNameToStream(stream, store.m_index);
		stream << ");";

		return stream;
	}